

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::SubmitExtraFiles(cmCTest *this,VectorOfStrings *files)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  char *local_1c0 [4];
  ostringstream cmCTestLog_msg;
  
  psVar4 = (string *)
           (files->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    psVar1 = (string *)
             (files->super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar4 == psVar1) {
LAB_002e14bd:
      return psVar4 == psVar1;
    }
    bVar2 = cmsys::SystemTools::FileExists(*(char **)psVar4);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Cannot find extra file: ");
      poVar3 = std::operator<<(poVar3,psVar4);
      poVar3 = std::operator<<(poVar3," to submit.");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x5fa,local_1c0[0],false);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      goto LAB_002e14bd;
    }
    AddSubmitFile(this,PartExtraFiles,*(char **)psVar4);
    psVar4 = psVar4 + 0x20;
  } while( true );
}

Assistant:

bool cmCTest::SubmitExtraFiles(const VectorOfStrings& files)
{
  VectorOfStrings::const_iterator it;
  for (it = files.begin(); it != files.end(); ++it) {
    if (!cmSystemTools::FileExists(it->c_str())) {
      cmCTestLog(this, ERROR_MESSAGE, "Cannot find extra file: "
                   << *it << " to submit." << std::endl;);
      return false;
    }
    this->AddSubmitFile(PartExtraFiles, it->c_str());
  }
  return true;
}